

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int page_write(Pager *pPager,Page *pPage)

{
  int iVar1;
  sxu32 iNum;
  sxu32 cksum;
  int rc;
  Page *pPage_local;
  Pager *pPager_local;
  
  if ((((pPager->is_mem == 0) && (pPager->no_jrnl == 0)) && (pPage->pgno < pPager->dbOrigSize)) &&
     (iVar1 = unqliteBitvecTest(pPager->pVec,pPage->pgno), iVar1 == 0)) {
    if (pPager->nRec == 0xffffffff) {
      unqliteGenError(pPager->pDb,"Journal record limit reached, commit your changes");
      return -7;
    }
    iVar1 = WriteInt64(pPager->pjfd,pPage->pgno,pPager->iJournalOfft);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = unqliteOsWrite(pPager->pjfd,pPage->zData,(long)pPager->iPageSize,
                           pPager->iJournalOfft + 8);
    if (iVar1 != 0) {
      return iVar1;
    }
    iNum = pager_cksum(pPager,pPage->zData);
    iVar1 = WriteInt32(pPager->pjfd,iNum,pPager->iJournalOfft + 8 + (long)pPager->iPageSize);
    if (iVar1 != 0) {
      return iVar1;
    }
    pPager->iJournalOfft = (long)(pPager->iPageSize + 0xc) + pPager->iJournalOfft;
    pPager->nRec = pPager->nRec + 1;
    unqliteBitvecSet(pPager->pVec,pPage->pgno);
  }
  pager_page_to_dirty_list(pPager,pPage);
  if ((pPager->dbSize < pPage->pgno + 1) &&
     (pPager->dbSize = pPage->pgno + 1, pPager->dbSize == 0xffffffffffffffff)) {
    unqliteGenError(pPager->pDb,"Database maximum page limit (64-bit) reached");
    pPager_local._4_4_ = -7;
  }
  else {
    pPager_local._4_4_ = 0;
  }
  return pPager_local._4_4_;
}

Assistant:

static int page_write(Pager *pPager,Page *pPage)
{
	int rc;
	if( !pPager->is_mem && !pPager->no_jrnl ){
		/* Write the page to the transaction journal */
		if( pPage->pgno < pPager->dbOrigSize && !unqliteBitvecTest(pPager->pVec,pPage->pgno) ){
			sxu32 cksum;
			if( pPager->nRec == SXU32_HIGH ){
				/* Journal Limit reached */
				unqliteGenError(pPager->pDb,"Journal record limit reached, commit your changes");
				return UNQLITE_LIMIT;
			}
			/* Write the page number */
			rc = WriteInt64(pPager->pjfd,pPage->pgno,pPager->iJournalOfft);
			if( rc != UNQLITE_OK ){ return rc; }
			/* Write the raw page */
			/** CODEC */
			rc = unqliteOsWrite(pPager->pjfd,pPage->zData,pPager->iPageSize,pPager->iJournalOfft + 8);
			if( rc != UNQLITE_OK ){ return rc; }
			/* Compute the checksum */
			cksum = pager_cksum(pPager,pPage->zData);
			rc = WriteInt32(pPager->pjfd,cksum,pPager->iJournalOfft + 8 + pPager->iPageSize);
			if( rc != UNQLITE_OK ){ return rc; }
			/* Update the journal offset */
			pPager->iJournalOfft += 8 /* page num */ + pPager->iPageSize + 4 /* cksum */;
			pPager->nRec++;
			/* Mark as journalled  */
			unqliteBitvecSet(pPager->pVec,pPage->pgno);
		}
	}
	/* Add the page to the dirty list */
	pager_page_to_dirty_list(pPager,pPage);
	/* Update the database size and return. */
	if( (1 + pPage->pgno) > pPager->dbSize ){
		pPager->dbSize = 1 + pPage->pgno;
		if( pPager->dbSize == SXU64_HIGH ){
			unqliteGenError(pPager->pDb,"Database maximum page limit (64-bit) reached");
			return UNQLITE_LIMIT;
		}
	}	
	return UNQLITE_OK;
}